

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ushort uVar1;
  uint uVar2;
  sqlite3 *psVar3;
  char *zLeft;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Expr *pEVar10;
  WhereTerm *pWVar11;
  Bitmask BVar12;
  bool bVar13;
  bool bVar14;
  Bitmask m;
  Bitmask mTerm;
  Expr *p;
  Expr *pX;
  u16 eOp;
  u8 bOnce;
  char *z2;
  char *z1;
  Bitmask ready;
  Bitmask orderDistinctMask;
  Bitmask obDone;
  Bitmask obSat;
  sqlite3 *db;
  Index *pIndex;
  CollSeq *pColl;
  Expr *pOBExpr;
  WhereTerm *pTerm;
  WhereLoop *pLoop;
  int iColumn;
  int iCur;
  int j;
  int i;
  int iLoop;
  ushort local_40;
  u16 nOrderBy;
  u16 nColumn;
  u16 nKeyCol;
  u16 eqOpMask;
  u8 isMatch;
  u8 distinctColumns;
  u8 isOrderDistinct;
  u8 revIdx;
  u8 rev;
  u8 revSet;
  WhereLoop *pLast_local;
  u16 nLoop_local;
  u16 wctrlFlags_local;
  WherePath *pPath_local;
  ExprList *pOrderBy_local;
  WhereInfo *pWInfo_local;
  
  pTerm = (WhereTerm *)0x0;
  psVar3 = pWInfo->pParse->db;
  obDone = 0;
  if (((nLoop != 0) && ((psVar3->dbOptFlags & 0x80) != 0)) ||
     (uVar2 = pOrderBy->nExpr, 0x3f < (ushort)uVar2)) {
    return '\0';
  }
  bVar14 = true;
  uVar9 = (1L << ((byte)uVar2 & 0x3f)) - 1;
  ready = 0;
  z1 = (char *)0x0;
  local_40 = 0x182;
  if ((wctrlFlags & 0x800) != 0) {
    local_40 = 0x183;
  }
  j = 0;
  do {
    bVar13 = false;
    if ((bVar14) && (bVar13 = false, obDone < uVar9)) {
      bVar13 = j <= (int)(uint)nLoop;
    }
    if (!bVar13) goto LAB_001a61ec;
    if (0 < j) {
      z1 = (char *)((ulong)pTerm->pWC | (ulong)z1);
    }
    pTerm = (WhereTerm *)pLast;
    if (((int)(uint)nLoop <= j) || (pTerm = (WhereTerm *)pPath->aLoop[j], (wctrlFlags & 0x800) == 0)
       ) {
      if (((pTerm->u).leftColumn & 0x400U) != 0) {
        if (*(char *)((long)&pTerm->leftCursor + 1) != '\0') {
          obDone = uVar9;
        }
LAB_001a61ec:
        if (obDone == uVar9) {
          return (byte)uVar2;
        }
        if (bVar14) {
          return -1;
        }
        iCur = uVar2 & 0xffff;
        do {
          iCur = iCur - 1;
          if (iCur < 1) {
            return '\0';
          }
          uVar9 = (1L << ((byte)iCur & 0x3f)) - 1;
        } while ((obDone & uVar9) != uVar9);
        return (byte)iCur;
      }
      *(undefined2 *)((long)&pTerm->leftCursor + 2) = 0;
      iVar8 = pWInfo->pTabList->a[(byte)pTerm->truthProb].iCursor;
      for (iCur = 0; iCur < (int)(uVar2 & 0xffff); iCur = iCur + 1) {
        if (((((1L << ((byte)iCur & 0x3f) & obDone) == 0) &&
             (pEVar10 = sqlite3ExprSkipCollate(pOrderBy->a[iCur].pExpr), pEVar10->op == 0x98)) &&
            (pEVar10->iTable == iVar8)) &&
           (pWVar11 = sqlite3WhereFindTerm
                                (&pWInfo->sWC,iVar8,(int)pEVar10->iColumn,
                                 (ulong)z1 ^ 0xffffffffffffffff,(uint)local_40,(Index *)0x0),
           pWVar11 != (WhereTerm *)0x0)) {
          if (pWVar11->eOperator == 1) {
            iColumn = 0;
            while( true ) {
              bVar13 = false;
              if (iColumn < (int)(uint)*(ushort *)((long)&pTerm->u + 4)) {
                bVar13 = pWVar11 != *(WhereTerm **)(pTerm->prereqAll + (long)iColumn * 8);
              }
              if (!bVar13) break;
              iColumn = iColumn + 1;
            }
            if ((int)(uint)*(ushort *)((long)&pTerm->u + 4) <= iColumn) goto LAB_001a5c17;
          }
          if (((pWVar11->eOperator & 0x82) != 0) && (-1 < pEVar10->iColumn)) {
            pIndex = (Index *)sqlite3ExprCollSeq(pWInfo->pParse,pOrderBy->a[iCur].pExpr);
            if (pIndex == (Index *)0x0) {
              pIndex = (Index *)psVar3->pDfltColl;
            }
            zLeft = pIndex->zName;
            pIndex = (Index *)sqlite3ExprCollSeq(pWInfo->pParse,pWVar11->pExpr);
            if (pIndex == (Index *)0x0) {
              pIndex = (Index *)psVar3->pDfltColl;
            }
            iVar7 = sqlite3StrICmp(zLeft,pIndex->zName);
            if (iVar7 != 0) goto LAB_001a5c17;
          }
          obDone = 1L << ((byte)iCur & 0x3f) | obDone;
        }
LAB_001a5c17:
      }
      if (((pTerm->u).leftColumn & 0x1000U) == 0) {
        if (((pTerm->u).leftColumn & 0x100U) == 0) {
          db = *(sqlite3 **)&pTerm->iField;
          if ((db == (sqlite3 *)0x0) || ((*(byte *)((long)&db->nextPagesize + 3) >> 2 & 1) != 0)) {
            return '\0';
          }
          iLoop._2_2_ = *(ushort *)&db->nSqlExec;
          iLoop._0_2_ = (ushort)db->nextPagesize;
          bVar14 = *(char *)((long)&db->nextPagesize + 2) != '\0';
        }
        else {
          db = (sqlite3 *)0x0;
          iLoop._2_2_ = 0;
          iLoop._0_2_ = 1;
        }
        bVar13 = false;
        nKeyCol._0_1_ = 0;
        bVar6 = false;
        for (iColumn = 0; iColumn < (int)(uint)(ushort)iLoop; iColumn = iColumn + 1) {
          bVar4 = true;
          if ((iColumn < (int)(uint)(ushort)pTerm->iParent) &&
             ((int)(uint)*(ushort *)((long)&pTerm->u + 6) <= iColumn)) {
            uVar1 = *(ushort *)(*(long *)(pTerm->prereqAll + (long)iColumn * 8) + 0x14);
            if ((uVar1 & local_40) == 0) {
              if ((uVar1 & 1) != 0) {
                iCur = iColumn;
                do {
                  iCur = iCur + 1;
                  if ((int)(uint)(ushort)pTerm->iParent <= iCur) goto LAB_001a5dcf;
                } while (**(long **)(pTerm->prereqAll + (long)iCur * 8) !=
                         **(long **)(pTerm->prereqAll + (long)iColumn * 8));
                bVar4 = false;
              }
              goto LAB_001a5dcf;
            }
            if ((uVar1 & 0x100) != 0) {
              bVar14 = false;
            }
          }
          else {
LAB_001a5dcf:
            if (db == (sqlite3 *)0x0) {
              pLoop._4_4_ = -1;
              nColumn._1_1_ = 0;
            }
            else {
              pLoop._4_4_ = (int)*(short *)((long)&db->pVdbe->db + (long)iColumn * 2);
              nColumn._1_1_ = *(byte *)(db->szMmap + (long)iColumn);
              if (pLoop._4_4_ == *(short *)((long)&db->mutex[1].mutex + 0x1c)) {
                pLoop._4_4_ = -1;
              }
            }
            if ((((bVar14) && (-1 < pLoop._4_4_)) && ((int)(uint)(ushort)pTerm->iParent <= iColumn))
               && (*(char *)(*(long *)((long)&db->mutex->mutex + 8) + (long)pLoop._4_4_ * 0x20 +
                            0x18) == '\0')) {
              bVar14 = false;
            }
            bVar5 = false;
            for (iCur = 0; bVar4 && iCur < (int)(uVar2 & 0xffff); iCur = iCur + 1) {
              if ((1L << ((byte)iCur & 0x3f) & obDone) == 0) {
                pEVar10 = sqlite3ExprSkipCollate(pOrderBy->a[iCur].pExpr);
                if ((wctrlFlags & 0xc0) == 0) {
                  bVar4 = false;
                }
                if (pLoop._4_4_ < -1) {
                  iVar7 = sqlite3ExprCompare((Parse *)0x0,pEVar10,
                                             *(Expr **)(*(long *)&db->dbOptFlags + 8 +
                                                       (long)iColumn * 0x20),iVar8);
                  if (iVar7 == 0) goto LAB_001a5f6b;
                }
                else if (((pEVar10->op == 0x98) && (pEVar10->iTable == iVar8)) &&
                        (pEVar10->iColumn == pLoop._4_4_)) {
LAB_001a5f6b:
                  if (-1 < pLoop._4_4_) {
                    pIndex = (Index *)sqlite3ExprCollSeq(pWInfo->pParse,pOrderBy->a[iCur].pExpr);
                    if (pIndex == (Index *)0x0) {
                      pIndex = (Index *)psVar3->pDfltColl;
                    }
                    iVar7 = sqlite3StrICmp(pIndex->zName,
                                           *(char **)(*(long *)&db->openFlags + (long)iColumn * 8));
                    if (iVar7 != 0) goto LAB_001a5fe9;
                  }
                  *(short *)((long)&pTerm->leftCursor + 2) = (short)iColumn + 1;
                  bVar5 = true;
                  break;
                }
              }
LAB_001a5fe9:
            }
            if ((bVar5) && ((wctrlFlags & 0x40) == 0)) {
              if (bVar13) {
                if (((byte)nKeyCol ^ nColumn._1_1_) != pOrderBy->a[iCur].sortOrder) {
                  bVar5 = false;
                }
              }
              else {
                nKeyCol._0_1_ = nColumn._1_1_ ^ pOrderBy->a[iCur].sortOrder;
                if ((byte)nKeyCol != 0) {
                  *pRevMask = 1L << ((byte)j & 0x3f) | *pRevMask;
                }
                bVar13 = true;
              }
            }
            if (!bVar5) {
              if ((iColumn == 0) || (iColumn < (int)(uint)iLoop._2_2_)) {
                bVar14 = false;
              }
              break;
            }
            if (pLoop._4_4_ == -1) {
              bVar6 = true;
            }
            obDone = 1L << ((byte)iCur & 0x3f) | obDone;
          }
        }
        if (bVar6) {
          bVar14 = true;
        }
      }
      if (bVar14) {
        ready = (ulong)pTerm->pWC | ready;
        for (iCur = 0; iCur < (int)(uVar2 & 0xffff); iCur = iCur + 1) {
          if ((1L << ((byte)iCur & 0x3f) & obDone) == 0) {
            pEVar10 = pOrderBy->a[iCur].pExpr;
            BVar12 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar10);
            if (((BVar12 != 0) || (iVar8 = sqlite3ExprIsConstant(pEVar10), iVar8 != 0)) &&
               ((BVar12 & (ready ^ 0xffffffffffffffff)) == 0)) {
              obDone = 1L << ((byte)iCur & 0x3f) | obDone;
            }
          }
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        const char *z1, *z2;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z1 = pColl->zName;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pTerm->pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z2 = pColl->zName;
        if( sqlite3StrICmp(z1, z2)!=0 ) continue;
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = -1;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=(-1) ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            if( sqlite3ExprCompare(0,
                  pOBExpr,pIndex->aColExpr->a[j].pExpr,iCur) ){
              continue;
            }
          }
          if( iColumn>=0 ){
            pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( !pColl ) pColl = db->pDfltColl;
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}